

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O1

bool __thiscall DataFilters::StringFilter::isFiltered(StringFilter *this,string *token)

{
  bool bVar1;
  size_type sVar2;
  pointer pcVar3;
  undefined1 *puVar4;
  int iVar5;
  long lVar6;
  size_type sVar7;
  bool bVar8;
  string input;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_48 = 0;
  local_40 = 0;
  local_50 = &local_40;
  std::__cxx11::string::_M_assign((string *)&local_50,(string *)token);
  puVar4 = local_50;
  if ((this->_isSensitive == false) && (sVar2 = token->_M_string_length, sVar2 != 0)) {
    pcVar3 = (token->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      iVar5 = toupper((int)pcVar3[sVar7]);
      puVar4[sVar7] = (char)iVar5;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
  }
  if (this->_isExact == true) {
    iVar5 = std::__cxx11::string::compare((string *)&local_50,(string *)this);
    bVar8 = iVar5 == 0;
  }
  else {
    lVar6 = std::__cxx11::string::find
                      ((string *)&local_50,(this->_pattern)._M_dataplus._M_p,0,
                       (this->_pattern)._M_string_length);
    bVar8 = lVar6 != -1;
  }
  bVar1 = this->_isAccept;
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return (bool)(bVar8 ^ bVar1 ^ 1);
}

Assistant:

bool
        isFiltered(std::string const & token) const
        {

            std::string input;
            
            // Check if filtering is case sensitive
            input = token;
            if (!this->_isSensitive)
            {
                std::transform(token.begin(), token.end(), input.begin(), ::toupper);
            }
            
            // Check if filtering is exact or not
            bool isMatch = false;
            if (this->_isExact)
            {
                isMatch = input.compare(this->_pattern) == 0;
            }
            else
            {
                isMatch = input.find(this->_pattern) != std::string::npos;
            }
            
            return (this->_isAccept ? isMatch : !isMatch);
            
        }